

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall
fileStoreFixture::fileStoreFixture(fileStoreFixture *this,bool resetBefore,bool reset)

{
  string *beginString;
  string *senderCompID;
  string *targetCompID;
  MessageStore *pMVar1;
  undefined1 local_3b0 [32];
  string local_390;
  allocator<char> local_369;
  STRING local_368;
  StringField local_348;
  allocator<char> local_2e9;
  STRING local_2e8;
  StringField local_2c8;
  allocator<char> local_269;
  STRING local_268;
  StringField local_248;
  undefined1 local_1f0 [8];
  SessionID sessionID;
  string local_98;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  byte local_12;
  byte local_11;
  bool reset_local;
  fileStoreFixture *pfStack_10;
  bool resetBefore_local;
  fileStoreFixture *this_local;
  
  local_12 = reset;
  local_11 = resetBefore;
  pfStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"store",&local_39);
  FIX::FileStoreFactory::FileStoreFactory(&this->factory,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  if ((local_11 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"SETGET",&local_71);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"TEST",
               (allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
    FIX::deleteSession(&local_70,&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator
              ((allocator<char> *)(sessionID.m_frozenString.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"FIX.4.2",&local_269);
  FIX::BeginString::BeginString((BeginString *)&local_248,&local_268);
  beginString = FIX::StringField::operator_cast_to_string_(&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"SETGET",&local_2e9);
  FIX::SenderCompID::SenderCompID((SenderCompID *)&local_2c8,&local_2e8);
  senderCompID = FIX::StringField::operator_cast_to_string_(&local_2c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,"TEST",&local_369);
  FIX::TargetCompID::TargetCompID((TargetCompID *)&local_348,&local_368);
  targetCompID = FIX::StringField::operator_cast_to_string_(&local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_390,"",(allocator<char> *)(local_3b0 + 0x1f));
  FIX::SessionID::SessionID((SessionID *)local_1f0,beginString,senderCompID,targetCompID,&local_390)
  ;
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)(local_3b0 + 0x1f));
  FIX::TargetCompID::~TargetCompID((TargetCompID *)&local_348);
  std::__cxx11::string::~string((string *)&local_368);
  std::allocator<char>::~allocator(&local_369);
  FIX::SenderCompID::~SenderCompID((SenderCompID *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  FIX::BeginString::~BeginString((BeginString *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  FIX::UtcTimeStamp::now();
  pMVar1 = (MessageStore *)
           FIX::FileStoreFactory::create((UtcTimeStamp *)this,(SessionID *)local_3b0);
  this->object = pMVar1;
  FIX::UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)local_3b0);
  this->resetAfter = (bool)(local_12 & 1);
  FIX::SessionID::~SessionID((SessionID *)local_1f0);
  return;
}

Assistant:

fileStoreFixture(bool resetBefore, bool reset)
      : factory("store") {
    if (resetBefore) {
      deleteSession("SETGET", "TEST");
    }

    SessionID sessionID(BeginString("FIX.4.2"), SenderCompID("SETGET"), TargetCompID("TEST"));

    object = factory.create(UtcTimeStamp::now(), sessionID);

    this->resetAfter = reset;
  }